

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pbVar1;
  type *ptVar2;
  bool bVar3;
  long lVar4;
  pointer pcVar5;
  _List_node_base *p_Var6;
  undefined1 auVar7 [8];
  basic_option<char> *pbVar8;
  uint uVar9;
  header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>_*,_boost::multi_index::multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
  hVar10;
  size_type sVar11;
  char cVar12;
  ostream oVar13;
  long *plVar14;
  char *pcVar15;
  typed_value<bool,_char> *ptVar16;
  typed_value<unsigned_int,_char> *ptVar17;
  typed_value<pgi::PolicyInitialization,_char> *ptVar18;
  typed_value<unsigned_long,_char> *ptVar19;
  typed_value<int,_char> *ptVar20;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar21;
  options_description *poVar22;
  const_iterator cVar23;
  any *paVar24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar25;
  bool *pbVar26;
  ostream *poVar27;
  uint *puVar28;
  joint_vertex_t qstart;
  pointer pbVar29;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar30;
  basic_option<char> *pbVar31;
  ulong uVar32;
  DiscreteSpace<pgi::DiscreteAction> *extraout_RDX;
  DiscreteSpace<pgi::DiscreteAction> *extraout_RDX_00;
  DiscreteSpace<pgi::DiscreteAction> *extraout_RDX_01;
  DiscreteSpace<pgi::DiscreteAction> *extraout_RDX_02;
  DiscreteSpace<pgi::DiscreteAction> *extraout_RDX_03;
  DiscreteSpace<pgi::DiscreteAction> *extraout_RDX_04;
  DiscreteSpace<pgi::DiscreteObservation> *d;
  DiscreteSpace<pgi::DiscreteAction> *extraout_RDX_05;
  DiscreteSpace<pgi::DiscreteAction> *extraout_RDX_06;
  DiscreteSpace<pgi::DiscreteAction> *extraout_RDX_07;
  DiscreteSpace<pgi::DiscreteAction> *extraout_RDX_08;
  DiscreteSpace<pgi::DiscreteAction> *extraout_RDX_09;
  DiscreteSpace<pgi::DiscreteAction> *extraout_RDX_10;
  DiscreteSpace<pgi::DiscreteAction> *pDVar33;
  DiscreteSpace<pgi::DiscreteObservation> *d_00;
  int iVar34;
  PolicyGraph *pPVar35;
  char cVar36;
  pointer pbVar37;
  ostream *poVar38;
  uint uVar39;
  ulong uVar40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  MADPDecPOMDPDiscrete madp;
  string __str_2;
  int improvement_steps;
  PolicyInitialization policy_initialization;
  string __str_4;
  uint width;
  uint rng_seed;
  vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
  local_policy_graphs;
  belief_t initial_belief;
  ImprovementResult bp;
  size_t max_history_cache_size;
  size_t blind_policy_initial_joint_action;
  uint horizon;
  variables_map vm;
  DecPOMDPDiscrete decpomdp;
  JointPolicy jp;
  positional_options_description pp;
  ostringstream ss_1;
  options_description cmdline_options;
  options_description hidden;
  options_description config;
  ofstream fvalue;
  HistoryCache cache;
  ofstream ftime;
  ofstream fs;
  PRNG rng;
  ostringstream ss;
  undefined1 local_1b40 [32];
  _Head_base<0UL,_DecPOMDPDiscrete_*,_false> local_1b20;
  undefined1 local_1b18 [24];
  long lStack_1b00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1af8;
  pointer local_1ae8 [2];
  int local_1ad4;
  double local_1ad0;
  _Head_base<0UL,_pgi::ObservationInterface_*,_false> local_1ac8;
  _Head_base<0UL,_pgi::StateTransitionInterface_*,_false> local_1ac0;
  PolicyInitialization local_1ab4;
  ulong local_1ab0;
  basic_option<char> *local_1aa8;
  basic_option<char> *local_1aa0;
  long *local_1a98;
  pointer *local_1a90;
  uint local_1a88;
  undefined4 uStack_1a84;
  pointer local_1a80 [2];
  uint local_1a70;
  uint local_1a6c;
  vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
  local_1a68;
  element_type *local_1a48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1a40;
  double local_1a30;
  ios_base *local_1a28;
  belief_t local_1a20;
  long *local_1a10 [2];
  long local_1a00 [2];
  undefined1 local_19f0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_19e0;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
  local_19b0;
  vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
  local_1980;
  double local_1968;
  size_t local_1960;
  size_t local_1958;
  uint local_194c;
  code *local_1948 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_1938 [8];
  _Rb_tree_node_base local_1930;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1908 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_18d8;
  vector<pgi::DiscreteState,_std::allocator<pgi::DiscreteState>_> local_18a8;
  DecPOMDPDiscrete local_1890;
  JointPolicy local_17b0;
  BackPassProperties local_1728;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1710;
  long *local_16f8;
  long local_16e8 [2];
  undefined1 local_16d8 [8];
  header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>_*,_boost::multi_index::multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
  local_16d0;
  basic_option<char> local_16c8;
  ios_base local_1668 [136];
  ios_base local_15e0 [264];
  options_description local_14d8;
  undefined7 uStack_14d7;
  long local_14c8 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_14b0 [24];
  void *local_1498;
  undefined4 local_1490;
  undefined8 local_1488;
  undefined4 local_1480;
  long local_1478;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_1470 [24];
  options_description local_1458;
  undefined7 uStack_1457;
  long local_1448 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_1430 [24];
  void *local_1418;
  undefined4 local_1410;
  undefined8 local_1408;
  undefined4 local_1400;
  long local_13f8;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_13f0 [24];
  long *local_13d8 [2];
  long local_13c8 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_13b0 [24];
  void *local_1398;
  undefined4 local_1390;
  undefined8 local_1388;
  undefined4 local_1380;
  long local_1378;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_1370 [24];
  undefined1 local_1358 [8];
  pointer local_1350;
  undefined1 local_1348 [32];
  pointer local_1328;
  ios_base aiStack_1260 [264];
  JointPolicy local_1158;
  TreeCache<pgi::ActionObservation,_pgi::HistoryData> local_10d0;
  pointer local_1050;
  filebuf local_1048 [8];
  basic_option<char> local_1040 [2];
  ios_base aiStack_f58 [264];
  HistoryData local_e50;
  undefined1 local_e28 [8];
  pointer pAStack_e20;
  ActionObservation local_e18 [14];
  ios_base local_d30 [272];
  JointObservationSpace local_c20;
  JointActionSpace local_bc8;
  undefined1 local_b70 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b60 [2];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_b40 [32];
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_b20 [32];
  options_description *local_b00;
  uint local_1a8 [28];
  ios_base local_138 [264];
  
  std::__cxx11::string::string((string *)&local_1050,*argv,(allocator *)local_e28);
  plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_1050,0,(char *)0x0,0x173045);
  local_1358 = (undefined1  [8])local_1348;
  pbVar29 = (pointer)(plVar14 + 2);
  if ((pointer)*plVar14 == pbVar29) {
    local_1348._0_8_ = (pbVar29->string_key)._M_dataplus._M_p;
    local_1348._8_8_ = plVar14[3];
  }
  else {
    local_1348._0_8_ = (pbVar29->string_key)._M_dataplus._M_p;
    local_1358 = (undefined1  [8])*plVar14;
  }
  local_1350 = (pointer)plVar14[1];
  *plVar14 = (long)pbVar29;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append(local_1358);
  local_b70._0_8_ = local_b60;
  paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 == paVar30) {
    local_b60[0]._0_8_ = paVar30->_M_allocated_capacity;
    local_b60[0]._8_8_ = plVar14[3];
  }
  else {
    local_b60[0]._0_8_ = paVar30->_M_allocated_capacity;
    local_b70._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar14;
  }
  local_b70._8_8_ = plVar14[1];
  *plVar14 = (long)paVar30;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  uVar9 = (uint)boost::program_options::options_description::m_default_line_length;
  uVar39 = (uint)boost::program_options::options_description::m_default_line_length >> 1;
  boost::program_options::options_description::options_description
            ((options_description *)local_13d8,(string *)local_b70,
             (uint)boost::program_options::options_description::m_default_line_length,uVar39);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b70._0_8_ != local_b60) {
    operator_delete((void *)local_b70._0_8_,local_b60[0]._M_allocated_capacity + 1);
  }
  if (local_1358 != (undefined1  [8])local_1348) {
    operator_delete((void *)local_1358,(ulong)(local_1348._0_8_ + 1));
  }
  if (local_1050 != local_1040) {
    operator_delete(local_1050,(ulong)(local_1040[0].string_key._M_dataplus._M_p + 1));
  }
  local_1358 = (undefined1  [8])boost::program_options::options_description::add_options();
  pcVar15 = (char *)boost::program_options::options_description_easy_init::operator()
                              (local_1358,"help");
  ptVar16 = (typed_value<bool,_char> *)boost::program_options::bool_switch();
  local_17b0.vm.super_relation_set.super_set_adaptor<_a9378c49_>.
  super_ordered_associative_container_adaptor<_4bc0be94_>.super_type.super_type.dwfb._0_1_ = 0;
  ptVar16 = boost::program_options::typed_value<bool,_char>::default_value
                      (ptVar16,(bool *)&local_17b0);
  pcVar15 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar15,(value_semantic *)"verbose,v",(char *)ptVar16);
  ptVar17 = boost::program_options::value<unsigned_int>(&local_194c);
  local_16d8._0_4_ = 3;
  ptVar17 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                      (ptVar17,(uint *)local_16d8);
  pcVar15 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar15,(value_semantic *)"horizon,h",(char *)ptVar17);
  ptVar17 = boost::program_options::value<unsigned_int>(&local_1a70);
  local_1a8[0] = 3;
  ptVar17 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                      (ptVar17,local_1a8);
  pcVar15 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar15,(value_semantic *)"policy-width,w",(char *)ptVar17);
  ptVar18 = boost::program_options::value<pgi::PolicyInitialization>(&local_1ab4);
  local_1890.s_.v_.super__Vector_base<pgi::DiscreteState,_std::allocator<pgi::DiscreteState>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  ptVar18 = boost::program_options::typed_value<pgi::PolicyInitialization,_char>::default_value
                      (ptVar18,(PolicyInitialization *)&local_1890);
  pcVar15 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar15,(value_semantic *)"policy-initialization,p",(char *)ptVar18);
  ptVar19 = boost::program_options::value<unsigned_long>(&local_1958);
  local_1050 = (basic_option<char> *)0x0;
  ptVar19 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                      (ptVar19,(unsigned_long *)&local_1050);
  pcVar15 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar15,(value_semantic *)"blind-action,b",(char *)ptVar19);
  ptVar20 = boost::program_options::value<int>(&local_1ad4);
  local_1948[0] = (code *)CONCAT44(local_1948[0]._4_4_,9);
  ptVar20 = boost::program_options::typed_value<int,_char>::default_value(ptVar20,(int *)local_1948)
  ;
  pcVar15 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar15,(value_semantic *)"improvement-steps,i",(char *)ptVar20);
  ptVar16 = (typed_value<bool,_char> *)boost::program_options::bool_switch();
  local_1458 = (options_description)0x0;
  ptVar16 = boost::program_options::typed_value<bool,_char>::default_value
                      (ptVar16,(bool *)&local_1458);
  pcVar15 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar15,(value_semantic *)"use-lower-bound,l",(char *)ptVar16);
  ptVar16 = (typed_value<bool,_char> *)boost::program_options::bool_switch();
  local_14d8 = (options_description)0x0;
  ptVar16 = boost::program_options::typed_value<bool,_char>::default_value
                      (ptVar16,(bool *)&local_14d8);
  pcVar15 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar15,(value_semantic *)"use-entropy-reward,e",(char *)ptVar16);
  ptVar16 = (typed_value<bool,_char> *)boost::program_options::bool_switch();
  local_10d0.max_size_._0_1_ = 0;
  ptVar16 = boost::program_options::typed_value<bool,_char>::default_value
                      (ptVar16,(bool *)&local_10d0);
  pcVar15 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar15,(value_semantic *)"use-sparse,t",(char *)ptVar16);
  ptVar17 = boost::program_options::value<unsigned_int>(&local_1a6c);
  local_19f0._0_4_ = 0x499602d2;
  ptVar17 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                      (ptVar17,(uint *)local_19f0);
  pcVar15 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar15,(value_semantic *)"seed,s",(char *)ptVar17);
  ptVar21 = boost::program_options::value<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b70._0_8_ = local_b60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b70,"./","");
  ptVar21 = boost::program_options::
            typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
            ::default_value(ptVar21,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_b70);
  pcVar15 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar15,(value_semantic *)"output-prefix,o",(char *)ptVar21);
  ptVar19 = boost::program_options::value<unsigned_long>(&local_1960);
  local_e28 = (undefined1  [8])0x2faf080;
  ptVar19 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                      (ptVar19,(unsigned_long *)local_e28);
  boost::program_options::options_description_easy_init::operator()
            (pcVar15,(value_semantic *)"max-cache-size,m",(char *)ptVar19);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b70._0_8_ != local_b60) {
    operator_delete((void *)local_b70._0_8_,local_b60[0]._M_allocated_capacity + 1);
  }
  boost::program_options::positional_options_description::positional_options_description
            ((positional_options_description *)&local_1710);
  boost::program_options::positional_options_description::add((char *)&local_1710,0x1732c6);
  local_b70._0_8_ = local_b60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b70,"Hidden options","");
  boost::program_options::options_description::options_description
            (&local_1458,(string *)local_b70,uVar9,uVar39);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b70._0_8_ != local_b60) {
    operator_delete((void *)local_b70._0_8_,local_b60[0]._M_allocated_capacity + 1);
  }
  local_b70._0_8_ = boost::program_options::options_description::add_options();
  ptVar21 = boost::program_options::value<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  boost::program_options::options_description_easy_init::operator()
            (local_b70,(value_semantic *)"dpomdp-file",(char *)ptVar21);
  boost::program_options::options_description::options_description(&local_14d8,uVar9,uVar39);
  poVar22 = (options_description *)boost::program_options::options_description::add(&local_14d8);
  boost::program_options::options_description::add(poVar22);
  boost::program_options::variables_map::variables_map((variables_map *)local_1948);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)local_b70,argc,argv);
  boost::program_options::detail::cmdline::set_options_description((options_description *)local_b70)
  ;
  local_b00 = &local_14d8;
  boost::program_options::detail::cmdline::set_positional_options
            ((positional_options_description *)local_b70);
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)local_1358,(basic_command_line_parser<char> *)local_b70);
  boost::program_options::store
            ((basic_parsed_options *)local_1358,(variables_map *)local_1948,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_1358);
  boost::
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1(local_b20);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(local_b40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_b70);
  boost::program_options::notify((variables_map *)local_1948);
  local_b70._0_8_ = local_b60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b70,"help","");
  cVar23 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find(local_1938,(key_type *)local_b70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b70._0_8_ != local_b60) {
    operator_delete((void *)local_b70._0_8_,local_b60[0]._M_allocated_capacity + 1);
  }
  if (argc == 1 || cVar23._M_node != &local_1930) {
    plVar14 = (long *)boost::program_options::operator<<
                                ((ostream *)&std::cout,(options_description *)local_13d8);
    std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
  }
  else {
    local_b70._0_8_ = local_b60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b70,"dpomdp-file","");
    cVar23 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find(local_1938,(key_type *)local_b70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b70._0_8_ != local_b60) {
      operator_delete((void *)local_b70._0_8_,local_b60[0]._M_allocated_capacity + 1);
    }
    if (cVar23._M_node != &local_1930) {
      local_b70._0_8_ = local_b60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b70,"dpomdp-file","");
      paVar24 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((string *)local_1948);
      pbVar25 = boost::any_cast<std::__cxx11::string_const&>(paVar24);
      pgi::madpwrapper::MADPDecPOMDPDiscrete::MADPDecPOMDPDiscrete
                ((MADPDecPOMDPDiscrete *)&local_1b20,pbVar25);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b70._0_8_ != local_b60) {
        operator_delete((void *)local_b70._0_8_,local_b60[0]._M_allocated_capacity + 1);
      }
      local_b70._0_8_ = local_b60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b70,"verbose","");
      paVar24 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((string *)local_1948);
      pbVar26 = boost::any_cast<bool_const&>(paVar24);
      bVar3 = *pbVar26;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b70._0_8_ != local_b60) {
        operator_delete((void *)local_b70._0_8_,local_b60[0]._M_allocated_capacity + 1);
      }
      if (bVar3 != false) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Loaded problem file ",0x14);
        local_b70._0_8_ = local_b60;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b70,"dpomdp-file","");
        paVar24 = (any *)boost::program_options::abstract_variables_map::operator[]
                                   ((string *)local_1948);
        pbVar25 = boost::any_cast<std::__cxx11::string_const&>(paVar24);
        poVar27 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(pbVar25->_M_dataplus)._M_p,
                             pbVar25->_M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar27 + -0x18) + (char)poVar27);
        std::ostream::put((char)poVar27);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b70._0_8_ != local_b60) {
          operator_delete((void *)local_b70._0_8_,local_b60[0]._M_allocated_capacity + 1);
        }
      }
      pgi::make_state_space((StateSpace *)&local_18a8,(MADPDecPOMDPDiscrete *)&local_1b20);
      pgi::make_joint_action_space(&local_bc8,(MADPDecPOMDPDiscrete *)&local_1b20);
      pgi::make_joint_observation_space(&local_c20,(MADPDecPOMDPDiscrete *)&local_1b20);
      local_b70._0_8_ = local_b60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b70,"use-sparse","");
      paVar24 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((string *)local_1948);
      pbVar26 = boost::any_cast<bool_const&>(paVar24);
      pgi::make_transition_matrix((pgi *)&local_1ac0,(MADPDecPOMDPDiscrete *)&local_1b20,*pbVar26);
      local_1358 = (undefined1  [8])local_1348;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1358,"use-sparse","");
      paVar24 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((string *)local_1948);
      pbVar26 = boost::any_cast<bool_const&>(paVar24);
      pgi::make_observation_matrix((pgi *)&local_1ac8,(MADPDecPOMDPDiscrete *)&local_1b20,*pbVar26);
      local_1050 = local_1040;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1050,"use-entropy-reward","")
      ;
      paVar24 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((string *)local_1948);
      pbVar26 = boost::any_cast<bool_const&>(paVar24);
      pgi::make_reward_matrix((pgi *)&local_1a98,(MADPDecPOMDPDiscrete *)&local_1b20,*pbVar26);
      pgi::DecPOMDPDiscrete::DecPOMDPDiscrete
                (&local_1890,(StateSpace *)&local_18a8,&local_bc8,&local_c20,
                 (unique_ptr<pgi::StateTransitionInterface,_std::default_delete<pgi::StateTransitionInterface>_>
                  *)&local_1ac0,
                 (unique_ptr<pgi::ObservationInterface,_std::default_delete<pgi::ObservationInterface>_>
                  *)&local_1ac8,
                 (unique_ptr<pgi::RewardInterface,_std::default_delete<pgi::RewardInterface>_> *)
                 &local_1a98);
      if (local_1a98 != (long *)0x0) {
        (**(code **)(*local_1a98 + 8))();
      }
      local_1a98 = (long *)0x0;
      if (local_1050 != local_1040) {
        operator_delete(local_1050,(ulong)(local_1040[0].string_key._M_dataplus._M_p + 1));
      }
      if (local_1ac8._M_head_impl != (ObservationInterface *)0x0) {
        (*(local_1ac8._M_head_impl)->_vptr_ObservationInterface[1])();
      }
      local_1ac8._M_head_impl = (ObservationInterface *)0x0;
      if (local_1358 != (undefined1  [8])local_1348) {
        operator_delete((void *)local_1358,(ulong)(local_1348._0_8_ + 1));
      }
      if (local_1ac0._M_head_impl != (StateTransitionInterface *)0x0) {
        (*(local_1ac0._M_head_impl)->_vptr_StateTransitionInterface[1])();
      }
      local_1ac0._M_head_impl = (StateTransitionInterface *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b70._0_8_ != local_b60) {
        operator_delete((void *)local_b70._0_8_,local_b60[0]._M_allocated_capacity + 1);
      }
      local_c20.super_IndexSpace<unsigned_long>._vptr_IndexSpace =
           (_func_int **)&PTR__JointDiscreteSpace_001891b8;
      std::
      vector<pgi::DiscreteSpace<pgi::DiscreteObservation>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteObservation>_>_>
      ::~vector(&local_c20.local_);
      pgi::IndexSpace<unsigned_long>::~IndexSpace(&local_c20.super_IndexSpace<unsigned_long>);
      local_bc8.super_IndexSpace<unsigned_long>._vptr_IndexSpace =
           (_func_int **)&PTR__JointDiscreteSpace_00189150;
      std::
      vector<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
      ::~vector(&local_bc8.local_);
      pgi::IndexSpace<unsigned_long>::~IndexSpace(&local_bc8.super_IndexSpace<unsigned_long>);
      std::vector<pgi::DiscreteState,_std::allocator<pgi::DiscreteState>_>::~vector(&local_18a8);
      local_b70._0_8_ = local_b60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b70,"use-sparse","");
      paVar24 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((string *)local_1948);
      pbVar26 = boost::any_cast<bool_const&>(paVar24);
      pgi::make_initial_belief((pgi *)&local_1a48,(MADPDecPOMDPDiscrete *)&local_1b20,*pbVar26);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b70._0_8_ != local_b60) {
        operator_delete((void *)local_b70._0_8_,local_b60[0]._M_allocated_capacity + 1);
      }
      local_1358._0_4_ = local_1a6c;
      boost::random::
      mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
      ::seed((mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
              *)local_b70,(uint *)local_1358);
      local_1a68.
      super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1a68.
      super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1a68.
      super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (local_1890.jas_.local_.
          super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_1890.jas_.local_.
          super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar40 = 0;
        do {
          local_1050 = local_1040;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1050,"horizon","");
          paVar24 = (any *)boost::program_options::abstract_variables_map::operator[]
                                     ((string *)local_1948);
          puVar28 = boost::any_cast<unsigned_int_const&>(paVar24);
          pgi::fixed_width((PolicyGraph *)local_1358,*puVar28,(ulong)local_1a70,
                           local_1890.jas_.super_IndexSpace<unsigned_long>.num_elements_.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar40],
                           local_1890.jos_.super_IndexSpace<unsigned_long>.num_elements_.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar40]);
          std::
          vector<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,unsigned_long,unsigned_long,pgi::PGProperties,boost::listS>,std::allocator<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,unsigned_long,unsigned_long,pgi::PGProperties,boost::listS>>>
          ::
          emplace_back<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,unsigned_long,unsigned_long,pgi::PGProperties,boost::listS>>
                    ((vector<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,unsigned_long,unsigned_long,pgi::PGProperties,boost::listS>,std::allocator<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,unsigned_long,unsigned_long,pgi::PGProperties,boost::listS>>>
                      *)&local_1a68,
                     (adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>
                      *)local_1358);
          if (local_1328 != (pointer)0x0) {
            operator_delete(local_1328,0x18);
          }
          std::
          vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>::config::stored_vertex>_>
          ::~vector((vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>::config::stored_vertex>_>
                     *)(local_1348 + 8));
          auVar7 = local_1358;
          while (auVar7 != (undefined1  [8])local_1358) {
            pbVar29 = (pointer)(((type *)&((pointer)auVar7)->string_key)->m_edges).
                               super__List_base<boost::list_edge<unsigned_long,_unsigned_long>,_std::allocator<boost::list_edge<unsigned_long,_unsigned_long>_>_>
                               ._M_impl._M_node.super__List_node_base._M_next;
            operator_delete((void *)auVar7,0x28);
            auVar7 = (undefined1  [8])pbVar29;
          }
          if (local_1050 != local_1040) {
            operator_delete(local_1050,(ulong)(local_1040[0].string_key._M_dataplus._M_p + 1));
          }
          uVar40 = uVar40 + 1;
        } while (uVar40 < (ulong)(((long)local_1890.jas_.local_.
                                         super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_1890.jas_.local_.
                                         super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      if (local_1ab4 == random) {
        pgi::set_random(&local_1a68,(PRNG *)local_b70);
      }
      else if (local_1ab4 == greedy) {
        local_1a20.self_.
        super___shared_ptr<const_pgi::probability_mass_t<double,_long>::pmf_concept_t,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = local_1a48;
        local_1a20.self_.
        super___shared_ptr<const_pgi::probability_mass_t<double,_long>::pmf_concept_t,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = p_Stack_1a40;
        if (p_Stack_1a40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Stack_1a40->_M_use_count = p_Stack_1a40->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Stack_1a40->_M_use_count = p_Stack_1a40->_M_use_count + 1;
          }
        }
        pgi::set_open_loop_greedy(&local_1a68,&local_1a20,&local_1890);
        if (local_1a20.self_.
            super___shared_ptr<const_pgi::probability_mass_t<double,_long>::pmf_concept_t,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1a20.self_.
                     super___shared_ptr<const_pgi::probability_mass_t<double,_long>::pmf_concept_t,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
      }
      else if (local_1ab4 == blind) {
        pgi::set_random(&local_1a68,(PRNG *)local_b70);
        pgi::set_blind(&local_1a68,local_1958,&local_1890.jas_);
      }
      local_1358 = (undefined1  [8])local_1348;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1358,"verbose","");
      paVar24 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((string *)local_1948);
      pbVar26 = boost::any_cast<bool_const&>(paVar24);
      bVar3 = *pbVar26;
      if (local_1358 != (undefined1  [8])local_1348) {
        operator_delete((void *)local_1358,(ulong)(local_1348._0_8_ + 1));
      }
      if (bVar3 != false) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Initialized policy using ",0x19);
        poVar27 = pgi::operator<<((ostream *)&std::cout,&local_1ab4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar27," strategy",9);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar27 + -0x18) + (char)poVar27);
        std::ostream::put((char)poVar27);
        std::ostream::flush();
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      local_1358 = (undefined1  [8])local_1348;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1358,"output-prefix","");
      paVar24 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((string *)local_1948);
      pbVar25 = boost::any_cast<std::__cxx11::string_const&>(paVar24);
      poVar27 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(pbVar25->_M_dataplus)._M_p,
                           pbVar25->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar27,"step",4);
      lVar4 = *(long *)poVar27;
      *(undefined8 *)(poVar27 + *(long *)(lVar4 + -0x18) + 0x10) = 3;
      lVar4 = *(long *)(lVar4 + -0x18);
      poVar38 = poVar27 + lVar4;
      if (poVar27[lVar4 + 0xe1] == (ostream)0x0) {
        oVar13 = (ostream)std::ios::widen((char)poVar38);
        poVar38[0xe0] = oVar13;
        poVar38[0xe1] = (ostream)0x1;
      }
      poVar38[0xe0] = (ostream)0x30;
      poVar27 = (ostream *)std::ostream::operator<<(poVar27,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar27,"_",1);
      if (local_1358 != (undefined1  [8])local_1348) {
        operator_delete((void *)local_1358,(ulong)(local_1348._0_8_ + 1));
      }
      std::__cxx11::stringbuf::str();
      write_policy_to_file(&local_1a68,(string *)local_1358,&local_1890);
      if (local_1358 != (undefined1  [8])local_1348) {
        operator_delete((void *)local_1358,(ulong)(local_1348._0_8_ + 1));
      }
      local_e28 = (undefined1  [8])local_e18;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e28,"output-prefix","");
      paVar24 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((string *)local_1948);
      pbVar25 = boost::any_cast<std::__cxx11::string_const&>(paVar24);
      local_1050 = local_1040;
      pcVar5 = (pbVar25->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1050,pcVar5,pcVar5 + pbVar25->_M_string_length);
      std::__cxx11::string::append((char *)&local_1050);
      std::ofstream::ofstream(local_1358,(string *)&local_1050,_S_out);
      if (local_1050 != local_1040) {
        operator_delete(local_1050,(ulong)(local_1040[0].string_key._M_dataplus._M_p + 1));
      }
      if (local_e28 != (undefined1  [8])local_e18) {
        operator_delete((void *)local_e28,(ulong)((long)(size_t *)local_e18[0].action_index_ + 1));
      }
      local_16d8 = (undefined1  [8])&local_16c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_16d8,"output-prefix","");
      paVar24 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((string *)local_1948);
      pbVar25 = boost::any_cast<std::__cxx11::string_const&>(paVar24);
      pcVar5 = (pbVar25->_M_dataplus)._M_p;
      local_e28 = (undefined1  [8])local_e18;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_e28,pcVar5,pcVar5 + pbVar25->_M_string_length);
      std::__cxx11::string::append(local_e28);
      std::ofstream::ofstream(&local_1050,(string *)local_e28,_S_out);
      if (local_e28 != (undefined1  [8])local_e18) {
        operator_delete((void *)local_e28,(ulong)((long)(size_t *)local_e18[0].action_index_ + 1));
      }
      if (local_16d8 != (undefined1  [8])&local_16c8) {
        operator_delete((void *)local_16d8,(ulong)(local_16c8.string_key._M_dataplus._M_p + 1));
      }
      local_e50.probability_ = 1.0;
      local_e50.last_observation_probability_ = 0.0;
      local_e50.sum_of_expected_rewards_ = 0.0;
      local_e50.belief_.self_.
      super___shared_ptr<const_pgi::probability_mass_t<double,_long>::pmf_concept_t,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = local_1a48;
      local_e50.belief_.self_.
      super___shared_ptr<const_pgi::probability_mass_t<double,_long>::pmf_concept_t,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = p_Stack_1a40;
      local_1a48 = (element_type *)0x0;
      p_Stack_1a40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pgi::TreeCache<pgi::ActionObservation,_pgi::HistoryData>::TreeCache
                (&local_10d0,&local_e50,local_1960);
      if (local_e50.belief_.self_.
          super___shared_ptr<const_pgi::probability_mass_t<double,_long>::pmf_concept_t,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_e50.belief_.self_.
                   super___shared_ptr<const_pgi::probability_mass_t<double,_long>::pmf_concept_t,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      pgi::JointPolicy::JointPolicy(&local_17b0,&local_1a68);
      qstart = pgi::JointPolicy::root(&local_17b0);
      local_e28 = (undefined1  [8])0x0;
      pAStack_e20 = (pointer)0x0;
      local_e18[0].action_index_ = 0;
      local_1ad0 = pgi::value(&local_17b0,qstart,(History *)local_e28,&local_1890,&local_10d0);
      if (local_e28 != (undefined1  [8])0x0) {
        operator_delete((void *)local_e28,local_e18[0].action_index_ - (long)local_e28);
      }
      poVar27 = std::ostream::_M_insert<double>(local_1ad0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar27 + -0x18) + (char)poVar27);
      std::ostream::put((char)poVar27);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Policy value: ",0xe)
      ;
      poVar27 = std::ostream::_M_insert<double>(local_1ad0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar27 + -0x18) + (char)poVar27);
      std::ostream::put((char)poVar27);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Stored ",7);
      poVar27 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar27," histories in cache",0x13);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar27 + -0x18) + (char)poVar27);
      std::ostream::put((char)poVar27);
      std::ostream::flush();
      if (local_1890.jas_.local_.
          super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_1890.jas_.local_.
          super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_1aa8 = _VTT;
        local_1aa0 = _operator_delete__;
        uVar40 = 0;
        do {
          local_1b18._0_8_ = local_1b18 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1b18,"output-prefix","");
          paVar24 = (any *)boost::program_options::abstract_variables_map::operator[]
                                     ((string *)local_1948);
          pbVar25 = boost::any_cast<std::__cxx11::string_const&>(paVar24);
          local_1b40._0_8_ = local_1b40 + 0x10;
          pcVar5 = (pbVar25->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1b40,pcVar5,pcVar5 + pbVar25->_M_string_length);
          std::__cxx11::string::append(local_1b40);
          cVar36 = '\x01';
          if (9 < uVar40) {
            uVar32 = uVar40;
            cVar12 = '\x04';
            do {
              cVar36 = cVar12;
              if (uVar32 < 100) {
                cVar36 = cVar36 + -2;
                goto LAB_001451c1;
              }
              if (uVar32 < 1000) {
                cVar36 = cVar36 + -1;
                goto LAB_001451c1;
              }
              if (uVar32 < 10000) goto LAB_001451c1;
              bVar3 = 99999 < uVar32;
              uVar32 = uVar32 / 10000;
              cVar12 = cVar36 + '\x04';
            } while (bVar3);
            cVar36 = cVar36 + '\x01';
          }
LAB_001451c1:
          local_1af8._M_allocated_capacity = (size_type)local_1ae8;
          std::__cxx11::string::_M_construct((ulong)&local_1af8,cVar36);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)local_1af8._M_allocated_capacity,local_1af8._8_4_,uVar40);
          pbVar37 = (pointer)0xf;
          if ((pointer)local_1b40._0_8_ != (pointer)(local_1b40 + 0x10)) {
            pbVar37 = (pointer)local_1b40._16_8_;
          }
          pbVar1 = (pointer)((long)&((_Alloc_hider *)local_1b40._8_8_)->_M_p +
                            CONCAT44(local_1af8._12_4_,local_1af8._8_4_));
          if (pbVar37 < pbVar1) {
            pbVar37 = (pointer)0xf;
            if ((pointer *)local_1af8._M_allocated_capacity != local_1ae8) {
              pbVar37 = local_1ae8[0];
            }
            if (pbVar37 < pbVar1) goto LAB_00145231;
            plVar14 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_1af8,0,(char *)0x0,local_1b40._0_8_);
          }
          else {
LAB_00145231:
            plVar14 = (long *)std::__cxx11::string::_M_append
                                        (local_1b40,local_1af8._M_allocated_capacity);
          }
          local_19f0._0_8_ = &local_19e0;
          pbVar25 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (plVar14 + 2);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar14 ==
              pbVar25) {
            local_19e0._M_dataplus._M_p = (pbVar25->_M_dataplus)._M_p;
            local_19e0._M_string_length = plVar14[3];
          }
          else {
            local_19e0._M_dataplus._M_p = (pbVar25->_M_dataplus)._M_p;
            local_19f0._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar14;
          }
          local_19f0._8_8_ = plVar14[1];
          *plVar14 = (long)pbVar25;
          plVar14[1] = 0;
          *(undefined1 *)&(pbVar25->_M_dataplus)._M_p = 0;
          plVar14 = (long *)std::__cxx11::string::append((char *)local_19f0);
          local_16d8 = (undefined1  [8])&local_16c8;
          pbVar31 = (basic_option<char> *)(plVar14 + 2);
          if ((basic_option<char> *)*plVar14 == pbVar31) {
            local_16c8.string_key._M_dataplus._M_p = (pbVar31->string_key)._M_dataplus._M_p;
            local_16c8.string_key._M_string_length = plVar14[3];
          }
          else {
            local_16c8.string_key._M_dataplus._M_p = (pbVar31->string_key)._M_dataplus._M_p;
            local_16d8 = (undefined1  [8])*plVar14;
          }
          local_16d0.member =
               (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>
                *)plVar14[1];
          *plVar14 = (long)pbVar31;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          std::ofstream::ofstream(local_e28,(string *)local_16d8,_S_out);
          pDVar33 = extraout_RDX;
          if (local_16d8 != (undefined1  [8])&local_16c8) {
            operator_delete((void *)local_16d8,(ulong)(local_16c8.string_key._M_dataplus._M_p + 1));
            pDVar33 = extraout_RDX_00;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_19f0._0_8_
              != &local_19e0) {
            operator_delete((void *)local_19f0._0_8_,(ulong)(local_19e0._M_dataplus._M_p + 1));
            pDVar33 = extraout_RDX_01;
          }
          if ((pointer *)local_1af8._M_allocated_capacity != local_1ae8) {
            operator_delete((void *)local_1af8._M_allocated_capacity,
                            (ulong)((long)&(local_1ae8[0]->_M_dataplus)._M_p + 1));
            pDVar33 = extraout_RDX_02;
          }
          if ((pointer)local_1b40._0_8_ != (pointer)(local_1b40 + 0x10)) {
            operator_delete((void *)local_1b40._0_8_,(ulong)(local_1b40._16_8_ + 1));
            pDVar33 = extraout_RDX_03;
          }
          if ((pointer)local_1b18._0_8_ != (pointer)(local_1b18 + 0x10)) {
            operator_delete((void *)local_1b18._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_1b18._16_8_)->_M_p + 1));
            pDVar33 = extraout_RDX_04;
          }
          pPVar35 = local_17b0.locals_.
                    super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar40;
          pgi::element_names<pgi::DiscreteSpace<pgi::DiscreteAction>>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_16d8,
                     (pgi *)(local_1890.jas_.local_.
                             super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar40),pDVar33);
          pgi::element_names<pgi::DiscreteSpace<pgi::DiscreteObservation>>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_19f0,
                     (pgi *)(local_1890.jos_.local_.
                             super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteObservation>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteObservation>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar40),d);
          pgi::print((ostream *)local_e28,pPVar35,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_16d8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_19f0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_19f0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_16d8);
          local_e28 = (undefined1  [8])local_1aa8;
          *(basic_option<char> **)
           (local_e28 +
           (long)local_1aa8[-1].original_tokens.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) = local_1aa0;
          std::filebuf::~filebuf((filebuf *)&pAStack_e20);
          std::ios_base::~ios_base(local_d30);
          uVar40 = uVar40 + 1;
        } while (uVar40 < (ulong)(((long)local_1890.jas_.local_.
                                         super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_1890.jas_.local_.
                                         super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      local_19f0._0_8_ = &local_19e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_19f0,"output-prefix","");
      paVar24 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((string *)local_1948);
      pbVar25 = boost::any_cast<std::__cxx11::string_const&>(paVar24);
      local_16d8 = (undefined1  [8])&local_16c8;
      pcVar5 = (pbVar25->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_16d8,pcVar5,pcVar5 + pbVar25->_M_string_length);
      std::__cxx11::string::append(local_16d8);
      std::ofstream::ofstream(local_e28,(string *)local_16d8,_S_out);
      if (local_16d8 != (undefined1  [8])&local_16c8) {
        operator_delete((void *)local_16d8,(ulong)(local_16c8.string_key._M_dataplus._M_p + 1));
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_19f0._0_8_ !=
          &local_19e0) {
        operator_delete((void *)local_19f0._0_8_,(ulong)(local_19e0._M_dataplus._M_p + 1));
      }
      poVar27 = std::ostream::_M_insert<double>(local_1ad0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar27 + -0x18) + (char)poVar27);
      std::ostream::put((char)poVar27);
      std::ostream::flush();
      if (0 < local_1ad4) {
        local_1aa0 = _VTT;
        local_1aa8 = _operator_delete__;
        local_1a28 = local_15e0;
        local_1ab0 = 1;
        do {
          std::chrono::_V2::system_clock::now();
          local_16d8 = (undefined1  [8])&local_16c8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_16d8,"use-lower-bound","")
          ;
          paVar24 = (any *)boost::program_options::abstract_variables_map::operator[]
                                     ((string *)local_1948);
          pbVar26 = boost::any_cast<bool_const&>(paVar24);
          local_1728.use_lower_bound = *pbVar26;
          local_1728.prob_heuristic_improvement = 0.5;
          local_1728.prob_random_history_in_heuristic_improvement = 0.9;
          if (local_16d8 != (undefined1  [8])&local_16c8) {
            operator_delete((void *)local_16d8,(ulong)(local_16c8.string_key._M_dataplus._M_p + 1));
          }
          ptVar2 = &local_1158.vm.core.super_type;
          local_1158.vm.super_relation_set.super_set_adaptor<_a9378c49_>.
          super_ordered_associative_container_adaptor<_4bc0be94_>.super_type.super_type.dwfb.data =
               (ordered_index<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_true>,_unsigned_long,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long>,_boost::bimaps::relation::member_at::right>,_true>::left>,_std::less<unsigned_long>,_boost::multi_index::detail::nth_layer<2,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::left,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                *)ptVar2;
          boost::multi_index::
          multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
          ::multi_index_container(&local_1158.vm.core,&local_17b0.vm.core);
          local_1158.vm.left.super_map_adaptor<_569608af_>.
          super_ordered_associative_container_adaptor<_9818fa0b_>.super_type.super_type.dwfb.data =
               (map_adaptor<_569608af_>)(map_adaptor<_569608af_>)ptVar2;
          local_1158.vm.right.super_map_adaptor<_ded78ca0_>.
          super_ordered_associative_container_adaptor<_574dd94b_>.super_type.super_type.dwfb.data =
               (map_adaptor<_ded78ca0_>)(map_adaptor<_ded78ca0_>)ptVar2;
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
          ::_Rb_tree(&local_1158.stepmap._M_t,&local_17b0.stepmap._M_t);
          std::
          vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
          ::vector(&local_1158.locals_,&local_17b0.locals_);
          pgi::backpass::improve
                    ((ImprovementResult *)local_19f0,&local_1158,&local_1890,&local_10d0,
                     (PRNG *)local_b70,&local_1728);
          std::
          vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
          ::~vector(&local_1158.locals_);
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
          ::~_Rb_tree(&local_1158.stepmap._M_t);
          boost::multi_index::
          multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
          ::~multi_index_container(&local_1158.vm.core);
          std::chrono::_V2::system_clock::now();
          poVar27 = std::ostream::_M_insert<long>((long)&local_1050);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar27 + -0x18) + (char)poVar27);
          std::ostream::put((char)poVar27);
          std::ostream::flush();
          poVar27 = std::ostream::_M_insert<double>(local_1968);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar27 + -0x18) + (char)poVar27);
          std::ostream::put((char)poVar27);
          std::ostream::flush();
          local_1a30 = local_1968;
          if (local_1ad0 < local_1968) {
            boost::multi_index::
            multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
            ::multi_index_container
                      ((multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
                        *)local_16d8,
                       (multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
                        *)&local_19e0,(allocator_type *)local_1b40);
            sVar11 = local_17b0.vm.core.node_count;
            hVar10.member =
                 local_17b0.vm.core.
                 super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>_*,_boost::multi_index::multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
                 .member;
            local_17b0.vm.core.
            super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>_*,_boost::multi_index::multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
            .member = local_16d0.member;
            local_16d0.member = hVar10.member;
            local_17b0.vm.core.node_count = local_16c8.string_key._M_string_length;
            local_16c8.string_key._M_string_length = sVar11;
            boost::multi_index::
            multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
            ::~multi_index_container
                      ((multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
                        *)local_16d8);
            std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
            ::operator=(&local_17b0.stepmap._M_t,&local_19b0);
            std::
            vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
            ::operator=(&local_17b0.locals_,&local_1980);
            if (local_1890.jas_.local_.
                super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_1890.jas_.local_.
                super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              uVar40 = 0;
              do {
                local_1a10[0] = local_1a00;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1a10,"output-prefix","");
                paVar24 = (any *)boost::program_options::abstract_variables_map::operator[]
                                           ((string *)local_1948);
                pbVar25 = boost::any_cast<std::__cxx11::string_const&>(paVar24);
                local_1af8._M_allocated_capacity = (size_type)local_1ae8;
                pcVar5 = (pbVar25->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1af8,pcVar5,pcVar5 + pbVar25->_M_string_length);
                std::__cxx11::string::append(local_1af8._M_local_buf);
                cVar36 = '\x01';
                if (9 < uVar40) {
                  uVar32 = uVar40;
                  cVar12 = '\x04';
                  do {
                    cVar36 = cVar12;
                    if (uVar32 < 100) {
                      cVar36 = cVar36 + -2;
                      goto LAB_00145955;
                    }
                    if (uVar32 < 1000) {
                      cVar36 = cVar36 + -1;
                      goto LAB_00145955;
                    }
                    if (uVar32 < 10000) goto LAB_00145955;
                    bVar3 = 99999 < uVar32;
                    uVar32 = uVar32 / 10000;
                    cVar12 = cVar36 + '\x04';
                  } while (bVar3);
                  cVar36 = cVar36 + '\x01';
                }
LAB_00145955:
                local_1a90 = local_1a80;
                std::__cxx11::string::_M_construct((ulong)&local_1a90,cVar36);
                std::__detail::__to_chars_10_impl<unsigned_long>
                          ((char *)local_1a90,local_1a88,uVar40);
                pbVar37 = (pointer)0xf;
                if ((pointer *)local_1af8._M_allocated_capacity != local_1ae8) {
                  pbVar37 = local_1ae8[0];
                }
                pbVar1 = (pointer)(CONCAT44(uStack_1a84,local_1a88) +
                                  CONCAT44(local_1af8._12_4_,local_1af8._8_4_));
                if (pbVar37 < pbVar1) {
                  pbVar37 = (pointer)0xf;
                  if (local_1a90 != local_1a80) {
                    pbVar37 = local_1a80[0];
                  }
                  if (pbVar37 < pbVar1) goto LAB_001459e0;
                  plVar14 = (long *)std::__cxx11::string::replace
                                              ((ulong)&local_1a90,0,(char *)0x0,
                                               local_1af8._M_allocated_capacity);
                }
                else {
LAB_001459e0:
                  plVar14 = (long *)std::__cxx11::string::_M_append
                                              (local_1af8._M_local_buf,(ulong)local_1a90);
                }
                local_1b18._0_8_ = local_1b18 + 0x10;
                pbVar37 = (pointer)(plVar14 + 2);
                if ((pointer)*plVar14 == pbVar37) {
                  local_1b18._16_8_ = (pbVar37->_M_dataplus)._M_p;
                  lStack_1b00 = plVar14[3];
                }
                else {
                  local_1b18._16_8_ = (pbVar37->_M_dataplus)._M_p;
                  local_1b18._0_8_ = (pointer)*plVar14;
                }
                local_1b18._8_8_ = plVar14[1];
                *plVar14 = (long)pbVar37;
                plVar14[1] = 0;
                *(undefined1 *)&(pbVar37->_M_dataplus)._M_p = 0;
                plVar14 = (long *)std::__cxx11::string::append(local_1b18);
                local_1b40._0_8_ = local_1b40 + 0x10;
                pbVar37 = (pointer)(plVar14 + 2);
                if ((pointer)*plVar14 == pbVar37) {
                  local_1b40._16_8_ = (pbVar37->_M_dataplus)._M_p;
                  local_1b40._24_8_ = plVar14[3];
                }
                else {
                  local_1b40._16_8_ = (pbVar37->_M_dataplus)._M_p;
                  local_1b40._0_8_ = (pointer)*plVar14;
                }
                local_1b40._8_8_ = plVar14[1];
                *plVar14 = (long)pbVar37;
                plVar14[1] = 0;
                *(undefined1 *)(plVar14 + 2) = 0;
                std::ofstream::ofstream
                          ((multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
                            *)local_16d8,(string *)local_1b40,_S_out);
                pDVar33 = extraout_RDX_05;
                if ((pointer)local_1b40._0_8_ != (pointer)(local_1b40 + 0x10)) {
                  operator_delete((void *)local_1b40._0_8_,(ulong)(local_1b40._16_8_ + 1));
                  pDVar33 = extraout_RDX_06;
                }
                if ((pointer)local_1b18._0_8_ != (pointer)(local_1b18 + 0x10)) {
                  operator_delete((void *)local_1b18._0_8_,
                                  (ulong)((long)&((_Alloc_hider *)local_1b18._16_8_)->_M_p + 1));
                  pDVar33 = extraout_RDX_07;
                }
                if (local_1a90 != local_1a80) {
                  operator_delete(local_1a90,(ulong)((long)&(local_1a80[0]->_M_dataplus)._M_p + 1));
                  pDVar33 = extraout_RDX_08;
                }
                if ((pointer *)local_1af8._M_allocated_capacity != local_1ae8) {
                  operator_delete((void *)local_1af8._M_allocated_capacity,
                                  (ulong)((long)&(local_1ae8[0]->_M_dataplus)._M_p + 1));
                  pDVar33 = extraout_RDX_09;
                }
                if (local_1a10[0] != local_1a00) {
                  operator_delete(local_1a10[0],local_1a00[0] + 1);
                  pDVar33 = extraout_RDX_10;
                }
                pPVar35 = local_17b0.locals_.
                          super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar40;
                pgi::element_names<pgi::DiscreteSpace<pgi::DiscreteAction>>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1b40,
                           (pgi *)(local_1890.jas_.local_.
                                   super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar40),pDVar33);
                pgi::element_names<pgi::DiscreteSpace<pgi::DiscreteObservation>>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1b18,
                           (pgi *)(local_1890.jos_.local_.
                                   super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteObservation>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteObservation>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar40),d_00);
                pgi::print((ostream *)local_16d8,pPVar35,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1b40,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1b18);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_1b18);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_1b40);
                local_16d8 = (undefined1  [8])local_1aa0;
                *(basic_option<char> **)
                 (local_16d8 +
                 (long)local_1aa0[-1].original_tokens.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish) = local_1aa8;
                std::filebuf::~filebuf((filebuf *)&local_16d0);
                std::ios_base::~ios_base(local_1a28);
                uVar40 = uVar40 + 1;
              } while (uVar40 < (ulong)(((long)local_1890.jas_.local_.
                                               super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_1890.jas_.local_.
                                               super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                       -0x5555555555555555));
            }
            local_1b18._0_8_ = local_1b18 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1b18,"output-prefix","")
            ;
            paVar24 = (any *)boost::program_options::abstract_variables_map::operator[]
                                       ((string *)local_1948);
            pbVar25 = boost::any_cast<std::__cxx11::string_const&>(paVar24);
            local_1b40._0_8_ = local_1b40 + 0x10;
            pcVar5 = (pbVar25->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1b40,pcVar5,pcVar5 + pbVar25->_M_string_length);
            std::__cxx11::string::append((char *)local_1b40);
            std::ofstream::ofstream
                      ((multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
                        *)local_16d8,(string *)local_1b40,_S_out);
            if ((pointer)local_1b40._0_8_ != (pointer)(local_1b40 + 0x10)) {
              operator_delete((void *)local_1b40._0_8_,(ulong)(local_1b40._16_8_ + 1));
            }
            if ((pointer)local_1b18._0_8_ != (pointer)(local_1b18 + 0x10)) {
              operator_delete((void *)local_1b18._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_1b18._16_8_)->_M_p + 1));
            }
            poVar27 = std::ostream::_M_insert<double>(local_1a30);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar27 + -0x18) + (char)poVar27);
            std::ostream::put((char)poVar27);
            std::ostream::flush();
            local_16d8 = (undefined1  [8])local_1aa0;
            *(basic_option<char> **)
             (local_16d8 +
             (long)local_1aa0[-1].original_tokens.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) = local_1aa8;
            std::filebuf::~filebuf((filebuf *)&local_16d0);
            std::ios_base::~ios_base(local_1a28);
            local_1ad0 = local_1a30;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Step ",5);
          poVar27 = (ostream *)std::ostream::operator<<(&std::cout,(int)local_1ab0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar27," of ",4);
          poVar27 = (ostream *)std::ostream::operator<<(poVar27,local_1ad4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar27,": ",2);
          poVar27 = std::ostream::_M_insert<double>(local_1968);
          std::__ostream_insert<char,std::char_traits<char>>(poVar27," (best: ",8);
          poVar27 = std::ostream::_M_insert<double>(local_1ad0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar27,")",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar27,", ",2);
          poVar27 = std::ostream::_M_insert<long>((long)poVar27);
          std::__ostream_insert<char,std::char_traits<char>>(poVar27," microseconds",0xd);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar27 + -0x18) + (char)poVar27);
          std::ostream::put((char)poVar27);
          std::ostream::flush();
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_16d8);
          local_1b40._0_8_ = local_1b40 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1b40,"output-prefix","");
          paVar24 = (any *)boost::program_options::abstract_variables_map::operator[]
                                     ((string *)local_1948);
          pbVar25 = boost::any_cast<std::__cxx11::string_const&>(paVar24);
          poVar27 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_16d8,(pbVar25->_M_dataplus)._M_p,
                               pbVar25->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar27,"/step",5);
          lVar4 = *(long *)poVar27;
          *(undefined8 *)(poVar27 + *(long *)(lVar4 + -0x18) + 0x10) = 3;
          lVar4 = *(long *)(lVar4 + -0x18);
          poVar38 = poVar27 + lVar4;
          if (poVar27[lVar4 + 0xe1] == (ostream)0x0) {
            oVar13 = (ostream)std::ios::widen((char)poVar38);
            poVar38[0xe0] = oVar13;
            poVar38[0xe1] = (ostream)0x1;
          }
          poVar38[0xe0] = (ostream)0x30;
          poVar27 = (ostream *)std::ostream::operator<<(poVar27,(int)local_1ab0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar27,"_",1);
          if ((pointer)local_1b40._0_8_ != (pointer)(local_1b40 + 0x10)) {
            operator_delete((void *)local_1b40._0_8_,(ulong)(local_1b40._16_8_ + 1));
          }
          std::__cxx11::stringbuf::str();
          write_policy_to_file(&local_17b0.locals_,(string *)local_1b40,&local_1890);
          if ((pointer)local_1b40._0_8_ != (pointer)(local_1b40 + 0x10)) {
            operator_delete((void *)local_1b40._0_8_,(ulong)(local_1b40._16_8_ + 1));
          }
          if (CONCAT71(local_10d0.max_size_._1_7_,(undefined1)local_10d0.max_size_) <
              local_10d0.m_._M_h._M_element_count) {
            pgi::TreeCache<pgi::ActionObservation,_pgi::HistoryData>::reset(&local_10d0);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_16d8);
          std::ios_base::~ios_base(local_1668);
          std::
          vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
          ::~vector(&local_1980);
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
          ::~_Rb_tree(&local_19b0);
          boost::multi_index::
          multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
          ::~multi_index_container
                    ((multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
                      *)&local_19e0);
          iVar34 = (int)local_1ab0;
          local_1ab0 = (ulong)(iVar34 + 1);
        } while (iVar34 < local_1ad4);
      }
      pbVar8 = _operator_delete__;
      pbVar31 = _VTT;
      local_e28 = (undefined1  [8])_VTT;
      *(basic_option<char> **)
       (local_e28 +
       (long)_VTT[-1].original_tokens.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) = _operator_delete__;
      std::filebuf::~filebuf((filebuf *)&pAStack_e20);
      std::ios_base::~ios_base(local_d30);
      std::
      vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
      ::~vector(&local_17b0.locals_);
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
      ::~_Rb_tree(&local_17b0.stepmap._M_t);
      boost::multi_index::
      multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
      ::~multi_index_container(&local_17b0.vm.core);
      std::
      _Hashtable<std::vector<pgi::ActionObservation,_std::allocator<pgi::ActionObservation>_>,_std::pair<const_std::vector<pgi::ActionObservation,_std::allocator<pgi::ActionObservation>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<pgi::ActionObservation,_std::allocator<pgi::ActionObservation>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<pgi::ActionObservation,_std::allocator<pgi::ActionObservation>_>_>,_boost::hash<std::vector<pgi::ActionObservation,_std::allocator<pgi::ActionObservation>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_10d0.m_._M_h);
      if (local_10d0.t_.m_property.px != (no_property *)0x0) {
        operator_delete(local_10d0.t_.m_property.px,1);
      }
      std::
      vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_pgi::HistoryData,_pgi::ActionObservation,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_pgi::HistoryData,_pgi::ActionObservation,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_pgi::HistoryData,_pgi::ActionObservation,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_pgi::HistoryData,_pgi::ActionObservation,_boost::no_property,_boost::listS>::config::stored_vertex>_>
      ::~vector(&local_10d0.t_.super_type.m_vertices);
      while ((Tree *)local_10d0.t_.super_type.m_edges.
                     super__List_base<boost::list_edge<unsigned_long,_pgi::ActionObservation>,_std::allocator<boost::list_edge<unsigned_long,_pgi::ActionObservation>_>_>
                     ._M_impl._M_node.super__List_node_base._M_next != &local_10d0.t_) {
        p_Var6 = (local_10d0.t_.super_type.m_edges.
                  super__List_base<boost::list_edge<unsigned_long,_pgi::ActionObservation>,_std::allocator<boost::list_edge<unsigned_long,_pgi::ActionObservation>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next)->_M_next;
        operator_delete(local_10d0.t_.super_type.m_edges.
                        super__List_base<boost::list_edge<unsigned_long,_pgi::ActionObservation>,_std::allocator<boost::list_edge<unsigned_long,_pgi::ActionObservation>_>_>
                        ._M_impl._M_node.super__List_node_base._M_next,0x30);
        local_10d0.t_.super_type.m_edges.
        super__List_base<boost::list_edge<unsigned_long,_pgi::ActionObservation>,_std::allocator<boost::list_edge<unsigned_long,_pgi::ActionObservation>_>_>
        ._M_impl._M_node.super__List_node_base._M_next = p_Var6;
      }
      local_1050 = pbVar31;
      *(basic_option<char> **)
       ((long)&local_1050 +
       (long)pbVar31[-1].original_tokens.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) = pbVar8;
      std::filebuf::~filebuf(local_1048);
      std::ios_base::~ios_base(aiStack_f58);
      local_1358 = (undefined1  [8])pbVar31;
      *(basic_option<char> **)
       (local_1358 +
       (long)pbVar31[-1].original_tokens.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) = pbVar8;
      std::filebuf::~filebuf((filebuf *)&local_1350);
      std::ios_base::~ios_base(aiStack_1260);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      std::
      vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
      ::~vector(&local_1a68);
      if (p_Stack_1a40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1a40);
      }
      if (local_1890.r_._M_t.
          super___uniq_ptr_impl<pgi::RewardInterface,_std::default_delete<pgi::RewardInterface>_>.
          _M_t.
          super__Tuple_impl<0UL,_pgi::RewardInterface_*,_std::default_delete<pgi::RewardInterface>_>
          .super__Head_base<0UL,_pgi::RewardInterface_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<pgi::RewardInterface,_std::default_delete<pgi::RewardInterface>_>)0x0) {
        (*(*(_func_int ***)
            local_1890.r_._M_t.
            super___uniq_ptr_impl<pgi::RewardInterface,_std::default_delete<pgi::RewardInterface>_>.
            _M_t.
            super__Tuple_impl<0UL,_pgi::RewardInterface_*,_std::default_delete<pgi::RewardInterface>_>
            .super__Head_base<0UL,_pgi::RewardInterface_*,_false>._M_head_impl)[1])();
      }
      local_1890.r_._M_t.
      super___uniq_ptr_impl<pgi::RewardInterface,_std::default_delete<pgi::RewardInterface>_>._M_t.
      super__Tuple_impl<0UL,_pgi::RewardInterface_*,_std::default_delete<pgi::RewardInterface>_>.
      super__Head_base<0UL,_pgi::RewardInterface_*,_false>._M_head_impl =
           (__uniq_ptr_data<pgi::RewardInterface,_std::default_delete<pgi::RewardInterface>,_true,_true>
            )(__uniq_ptr_impl<pgi::RewardInterface,_std::default_delete<pgi::RewardInterface>_>)0x0;
      if ((tuple<pgi::ObservationInterface_*,_std::default_delete<pgi::ObservationInterface>_>)
          local_1890.o_._M_t.
          super___uniq_ptr_impl<pgi::ObservationInterface,_std::default_delete<pgi::ObservationInterface>_>
          ._M_t.
          super__Tuple_impl<0UL,_pgi::ObservationInterface_*,_std::default_delete<pgi::ObservationInterface>_>
          .super__Head_base<0UL,_pgi::ObservationInterface_*,_false>._M_head_impl !=
          (_Head_base<0UL,_pgi::ObservationInterface_*,_false>)0x0) {
        (*(*(_func_int ***)
            local_1890.o_._M_t.
            super___uniq_ptr_impl<pgi::ObservationInterface,_std::default_delete<pgi::ObservationInterface>_>
            ._M_t.
            super__Tuple_impl<0UL,_pgi::ObservationInterface_*,_std::default_delete<pgi::ObservationInterface>_>
            .super__Head_base<0UL,_pgi::ObservationInterface_*,_false>._M_head_impl)[1])();
      }
      local_1890.o_._M_t.
      super___uniq_ptr_impl<pgi::ObservationInterface,_std::default_delete<pgi::ObservationInterface>_>
      ._M_t.
      super__Tuple_impl<0UL,_pgi::ObservationInterface_*,_std::default_delete<pgi::ObservationInterface>_>
      .super__Head_base<0UL,_pgi::ObservationInterface_*,_false>._M_head_impl =
           (__uniq_ptr_data<pgi::ObservationInterface,_std::default_delete<pgi::ObservationInterface>,_true,_true>
            )(__uniq_ptr_impl<pgi::ObservationInterface,_std::default_delete<pgi::ObservationInterface>_>
              )0x0;
      if ((_Tuple_impl<0UL,_pgi::StateTransitionInterface_*,_std::default_delete<pgi::StateTransitionInterface>_>
           )local_1890.t_._M_t.
            super___uniq_ptr_impl<pgi::StateTransitionInterface,_std::default_delete<pgi::StateTransitionInterface>_>
            ._M_t.
            super__Tuple_impl<0UL,_pgi::StateTransitionInterface_*,_std::default_delete<pgi::StateTransitionInterface>_>
            .super__Head_base<0UL,_pgi::StateTransitionInterface_*,_false>._M_head_impl !=
          (StateTransitionInterface *)0x0) {
        (*(*(_func_int ***)
            local_1890.t_._M_t.
            super___uniq_ptr_impl<pgi::StateTransitionInterface,_std::default_delete<pgi::StateTransitionInterface>_>
            ._M_t.
            super__Tuple_impl<0UL,_pgi::StateTransitionInterface_*,_std::default_delete<pgi::StateTransitionInterface>_>
            .super__Head_base<0UL,_pgi::StateTransitionInterface_*,_false>._M_head_impl)[1])();
      }
      local_1890.t_._M_t.
      super___uniq_ptr_impl<pgi::StateTransitionInterface,_std::default_delete<pgi::StateTransitionInterface>_>
      ._M_t.
      super__Tuple_impl<0UL,_pgi::StateTransitionInterface_*,_std::default_delete<pgi::StateTransitionInterface>_>
      .super__Head_base<0UL,_pgi::StateTransitionInterface_*,_false>._M_head_impl =
           (__uniq_ptr_data<pgi::StateTransitionInterface,_std::default_delete<pgi::StateTransitionInterface>,_true,_true>
            )(__uniq_ptr_impl<pgi::StateTransitionInterface,_std::default_delete<pgi::StateTransitionInterface>_>
              )0x0;
      local_1890.jos_.super_IndexSpace<unsigned_long>._vptr_IndexSpace =
           (_func_int **)&PTR__JointDiscreteSpace_001891b8;
      std::
      vector<pgi::DiscreteSpace<pgi::DiscreteObservation>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteObservation>_>_>
      ::~vector(&local_1890.jos_.local_);
      pgi::IndexSpace<unsigned_long>::~IndexSpace(&local_1890.jos_.super_IndexSpace<unsigned_long>);
      local_1890.jas_.super_IndexSpace<unsigned_long>._vptr_IndexSpace =
           (_func_int **)&PTR__JointDiscreteSpace_00189150;
      std::
      vector<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
      ::~vector(&local_1890.jas_.local_);
      pgi::IndexSpace<unsigned_long>::~IndexSpace(&local_1890.jas_.super_IndexSpace<unsigned_long>);
      std::vector<pgi::DiscreteState,_std::allocator<pgi::DiscreteState>_>::~vector
                ((vector<pgi::DiscreteState,_std::allocator<pgi::DiscreteState>_> *)&local_1890);
      if (local_1b20._M_head_impl != (DecPOMDPDiscrete *)0x0) {
        (**(code **)(*(long *)local_1b20._M_head_impl + 8))();
      }
      iVar34 = 0;
      goto LAB_00146262;
    }
    plVar14 = &std::cout;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"You must specify an input dpomdp file",0x25);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  }
  std::ostream::put((char)plVar14);
  iVar34 = 1;
  std::ostream::flush();
LAB_00146262:
  local_1948[0] = std::__cxx11::stringbuf::str;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_18d8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_1908);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(local_1938);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_1470);
  if (local_1498 != (void *)0x0) {
    operator_delete(local_1498,local_1478 - (long)local_1498);
    local_1498 = (void *)0x0;
    local_1490 = 0;
    local_1488 = 0;
    local_1480 = 0;
    local_1478 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_14b0);
  if ((long *)CONCAT71(uStack_14d7,local_14d8) != local_14c8) {
    operator_delete((long *)CONCAT71(uStack_14d7,local_14d8),local_14c8[0] + 1);
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_13f0);
  if (local_1418 != (void *)0x0) {
    operator_delete(local_1418,local_13f8 - (long)local_1418);
    local_1418 = (void *)0x0;
    local_1410 = 0;
    local_1408 = 0;
    local_1400 = 0;
    local_13f8 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_1430);
  if ((long *)CONCAT71(uStack_1457,local_1458) != local_1448) {
    operator_delete((long *)CONCAT71(uStack_1457,local_1458),local_1448[0] + 1);
  }
  if (local_16f8 != local_16e8) {
    operator_delete(local_16f8,local_16e8[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1710);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_1370);
  if (local_1398 != (void *)0x0) {
    operator_delete(local_1398,local_1378 - (long)local_1398);
    local_1398 = (void *)0x0;
    local_1390 = 0;
    local_1388 = 0;
    local_1380 = 0;
    local_1378 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_13b0);
  if (local_13d8[0] != local_13c8) {
    operator_delete(local_13d8[0],local_13c8[0] + 1);
  }
  return iVar34;
}

Assistant:

int main(int argc, char** argv) {
  unsigned int rng_seed;
  unsigned int horizon;
  unsigned int width;
  int improvement_steps;
  std::size_t blind_policy_initial_joint_action;
  std::size_t max_history_cache_size;
  pgi::PolicyInitialization policy_initialization;

  namespace po = boost::program_options;
  po::options_description config("NPGI planner for (Dec)POMDPs \nUsage: " +
                                 std::string(argv[0]) +
                                 " [OPTION]... [DPOMDP-FILE]\nOptions");
  config.add_options()("help", "produce help message")(
      "verbose,v", po::bool_switch()->default_value(false),
      "toggle for verbose output")(
      "horizon,h", po::value<unsigned int>(&horizon)->default_value(3),
      "problem horizon")("policy-width,w",
                         po::value<unsigned int>(&width)->default_value(3),
                         "policy width")(
      "policy-initialization,p",
      po::value<pgi::PolicyInitialization>(&policy_initialization)
          ->default_value(pgi::PolicyInitialization::random),
      "policy initialization type: (random | greedy | blind)")(
      "blind-action,b",
      po::value<std::size_t>(&blind_policy_initial_joint_action)
          ->default_value(0),
      "action for blind policy initialization")(
      "improvement-steps,i",
      po::value<int>(&improvement_steps)->default_value(9),
      "number of policy improvement steps")(
      "use-lower-bound,l", po::bool_switch()->default_value(false),
      "toggle to use lower bound")(
      "use-entropy-reward,e", po::bool_switch()->default_value(false),
      "toggle to use expected posterior entropy as final step reward")(
      "use-sparse,t", po::bool_switch()->default_value(false),
      "toggle to use sparse")(
      "seed,s", po::value<unsigned int>(&rng_seed)->default_value(1234567890),
      "random number seed")("output-prefix,o",
                            po::value<std::string>()->default_value("./"),
                            "output prefix")(
      "max-cache-size,m",
      po::value<std::size_t>(&max_history_cache_size)->default_value(5e7),
      "maximum history cache size");

  po::positional_options_description pp;
  pp.add("dpomdp-file", -1);

  po::options_description hidden("Hidden options");
  hidden.add_options()("dpomdp-file", po::value<std::string>(), "input file");

  po::options_description cmdline_options;
  cmdline_options.add(config).add(hidden);

  po::variables_map vm;
  po::store(po::command_line_parser(argc, argv)
                .options(cmdline_options)
                .positional(pp)
                .run(),
            vm);
  po::notify(vm);
  if (vm.count("help") || argc == 1) {
    std::cout << config << std::endl;
    return 1;
  }
  if (!vm.count("dpomdp-file")) {
    std::cout << "You must specify an input dpomdp file" << std::endl;
    return 1;
  }

  pgi::madpwrapper::MADPDecPOMDPDiscrete madp(
      vm["dpomdp-file"].as<std::string>());
  if (vm["verbose"].as<bool>())
    std::cout << "Loaded problem file " << vm["dpomdp-file"].as<std::string>()
              << std::endl;

  pgi::DecPOMDPDiscrete decpomdp(
      pgi::make_state_space(madp), pgi::make_joint_action_space(madp),
      pgi::make_joint_observation_space(madp),
      pgi::make_transition_matrix(madp, vm["use-sparse"].as<bool>()),
      pgi::make_observation_matrix(madp, vm["use-sparse"].as<bool>()),
      pgi::make_reward_matrix(madp, vm["use-entropy-reward"].as<bool>()));

  pgi::belief_t initial_belief =
      pgi::make_initial_belief(madp, vm["use-sparse"].as<bool>());

  pgi::PRNG rng(rng_seed);

  std::vector<pgi::PolicyGraph> local_policy_graphs;
  const pgi::JointActionSpace& jas = decpomdp.joint_action_space();
  const pgi::JointObservationSpace& jos = decpomdp.joint_observation_space();
  for (std::size_t agent = 0; agent < decpomdp.num_agents(); ++agent) {
    local_policy_graphs.emplace_back(pgi::fixed_width(
        vm["horizon"].as<unsigned int>(), width, jas.num_local_indices(agent),
        jos.num_local_indices(agent)));
  }

  if (policy_initialization == pgi::PolicyInitialization::random) {
    pgi::set_random(local_policy_graphs, rng);
  } else if (policy_initialization == pgi::PolicyInitialization::greedy) {
    pgi::set_open_loop_greedy(local_policy_graphs, initial_belief, decpomdp);
  } else if (policy_initialization == pgi::PolicyInitialization::blind) {
    pgi::set_random(local_policy_graphs,
                    rng);  // to randomize the edges in the policy
    pgi::set_blind(local_policy_graphs, blind_policy_initial_joint_action,
                   decpomdp.joint_action_space());
  }

  if (vm["verbose"].as<bool>())
    std::cout << "Initialized policy using " << policy_initialization
              << " strategy" << std::endl;

  std::ostringstream ss;
  ss << vm["output-prefix"].as<std::string>() << "step" << std::setw(3)
     << std::setfill('0') << 0 << "_";
  write_policy_to_file(local_policy_graphs, ss.str(), decpomdp);

  std::ofstream fvalue(vm["output-prefix"].as<std::string>() +
                       "policy_values.txt");
  std::ofstream ftime(vm["output-prefix"].as<std::string>() +
                      "duration_microseconds.txt");

  pgi::HistoryCache cache(pgi::HistoryData{1.0, 0.0, 0.0, std::move(initial_belief)}, max_history_cache_size);
  pgi::JointPolicy jp(local_policy_graphs);
  double best_value = pgi::value(jp, jp.root(), pgi::History(), decpomdp, cache);
  fvalue << best_value << std::endl;
  std::cout << "Policy value: " << best_value << std::endl;
  std::cout << "Stored " << cache.size() << " histories in cache"
            << std::endl;

  // write initial best policy and value
  for (std::size_t agent = 0; agent < decpomdp.num_agents(); ++agent) {
    std::ofstream fs(vm["output-prefix"].as<std::string>() +
                     "best_policy_agent" + std::to_string(agent) + ".dot");
    print(fs, jp.local_policy(agent),
          pgi::element_names(decpomdp.joint_action_space().get(agent)),
          pgi::element_names(decpomdp.joint_observation_space().get(agent)));
  }

  std::ofstream fs(vm["output-prefix"].as<std::string>() + "best_value.txt");
  fs << best_value << std::endl;

  for (int i = 1; i <= improvement_steps; ++i) {
    std::chrono::high_resolution_clock::time_point t1 =
        std::chrono::high_resolution_clock::now();
    pgi::backpass::BackPassProperties backprops(
        vm["use-lower-bound"].as<bool>());
    auto bp = pgi::backpass::improve(jp, decpomdp, cache, rng, backprops);
    std::chrono::high_resolution_clock::time_point t3 =
        std::chrono::high_resolution_clock::now();
    auto duration =
        std::chrono::duration_cast<std::chrono::microseconds>(t3 - t1).count();
    ftime << duration << std::endl;


    fvalue << bp.improved_policy_value << std::endl;

    if (bp.improved_policy_value > best_value) {
      best_value = bp.improved_policy_value;
      jp = bp.improved_policy;

      // update best policy and value!
      for (std::size_t agent = 0; agent < decpomdp.num_agents(); ++agent) {
        std::ofstream fs(vm["output-prefix"].as<std::string>() +
                         "best_policy_agent" + std::to_string(agent) + ".dot");
        print(fs, jp.local_policy(agent),
              pgi::element_names(decpomdp.joint_action_space().get(agent)),
              pgi::element_names(decpomdp.joint_observation_space().get(agent)));
      }

      std::ofstream fs(vm["output-prefix"].as<std::string>() + "best_value.txt");
      fs << best_value << std::endl;
    }

    std::cout << "Step " << i << " of " << improvement_steps << ": "
              << bp.improved_policy_value << " (best: " << best_value << ")"
              << ", " << duration << " microseconds" << std::endl;

    std::ostringstream ss;
    ss << vm["output-prefix"].as<std::string>() << "/step" << std::setw(3)
       << std::setfill('0') << i << "_";
    write_policy_to_file(jp.local_policies(), ss.str(), decpomdp);

    cache.ensure_size_within_limits();
  }

  return 0;
}